

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirQuantileState<long>::FillReservoir
          (ReservoirQuantileState<long> *this,idx_t sample_size,long element)

{
  idx_t iVar1;
  long in_RDX;
  ulong in_RSI;
  ReservoirQuantileState<long> *in_RDI;
  BaseReservoirSampling *unaff_retaddr;
  long *in_stack_ffffffffffffffd8;
  
  if (in_RDI->pos < in_RSI) {
    iVar1 = in_RDI->pos;
    in_RDI->pos = iVar1 + 1;
    in_RDI->v[iVar1] = in_RDX;
    BaseReservoirSampling::InitializeReservoirWeights(unaff_retaddr,(idx_t)in_RDI,in_RSI);
  }
  else if (in_RDI->r_samp->next_index_to_sample ==
           in_RDI->r_samp->num_entries_to_skip_b4_next_sample) {
    ReplaceElement(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}